

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass,SQInteger attributes)

{
  bool bVar1;
  SQChar *pSVar2;
  SQClass *x;
  undefined1 local_70 [8];
  SQObjectPtr ret;
  int nparams;
  undefined1 local_48 [8];
  SQObjectPtr attrs;
  SQClass *base;
  SQInteger attributes_local;
  SQInteger baseclass_local;
  SQObjectPtr *target_local;
  SQVM *this_local;
  
  attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
  if (baseclass != -1) {
    if ((this->_stack)._vals[this->_stackbase + baseclass].super_SQObject._type != OT_CLASS) {
      pSVar2 = GetTypeName((this->_stack)._vals + this->_stackbase + baseclass);
      Raise_Error(this,"trying to inherit from a %s",pSVar2);
      this_local._7_1_ = 0;
      goto LAB_0013b53f;
    }
    attrs.super_SQObject._unVal =
         (this->_stack)._vals[this->_stackbase + baseclass].super_SQObject._unVal;
  }
  if (attributes != 0xff) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)local_48,(this->_stack)._vals + this->_stackbase + attributes);
  }
  x = SQClass::Create(this->_sharedstate,attrs.super_SQObject._unVal.pClass);
  ::SQObjectPtr::operator=(target,x);
  if (((target->super_SQObject)._unVal.pClass)->_metamethods[0x11].super_SQObject._type != OT_NULL)
  {
    ret.super_SQObject._unVal.nInteger._4_4_ = 2;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_70);
    Push(this,target);
    Push(this,(SQObjectPtr *)local_48);
    bVar1 = Call(this,((target->super_SQObject)._unVal.pClass)->_metamethods + 0x11,
                 (long)(int)ret.super_SQObject._unVal.nInteger._4_4_,
                 this->_top - (long)(int)ret.super_SQObject._unVal.nInteger._4_4_,
                 (SQObjectPtr *)local_70,0);
    if (bVar1) {
      Pop(this,(long)(int)ret.super_SQObject._unVal.nInteger._4_4_);
    }
    else {
      Pop(this,(long)(int)ret.super_SQObject._unVal.nInteger._4_4_);
      this_local._7_1_ = 0;
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_70);
    if (!bVar1) goto LAB_0013b53f;
  }
  ::SQObjectPtr::operator=
            (&((target->super_SQObject)._unVal.pClass)->_attributes,(SQObjectPtr *)local_48);
  this_local._7_1_ = 1;
LAB_0013b53f:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass,SQInteger attributes)
{
    SQClass *base = NULL;
    SQObjectPtr attrs;
    if(baseclass != -1) {
        if(type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) { Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass])); return false; }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    if(attributes != MAX_FUNC_STACKSIZE) {
        attrs = _stack._vals[_stackbase+attributes];
    }
    target = SQClass::Create(_ss(this),base);
    if(type(_class(target)->_metamethods[MT_INHERITED]) != OT_NULL) {
        int nparams = 2;
        SQObjectPtr ret;
        Push(target); Push(attrs);
        if(!Call(_class(target)->_metamethods[MT_INHERITED],nparams,_top - nparams, ret, false)) {
            Pop(nparams);
            return false;
        }
        Pop(nparams);
    }
    _class(target)->_attributes = attrs;
    return true;
}